

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O1

void Assimp::SceneCombiner::MergeScenes
               (aiScene **_dest,aiScene *master,
               vector<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_> *srcList,
               uint flags)

{
  int *__src;
  _Rb_tree_header *p_Var1;
  ai_uint32 aVar2;
  aiMaterialProperty *paVar3;
  int *piVar4;
  aiMesh *paVar5;
  aiBone *paVar6;
  aiLight *paVar7;
  aiCamera *paVar8;
  aiNodeAnim *paVar9;
  long lVar10;
  bool bVar11;
  pointer pSVar12;
  char cVar13;
  uint uVar14;
  uint32_t uVar15;
  int iVar16;
  aiScene *paVar17;
  pointer pAVar18;
  aiTexture **_dest_00;
  aiMaterial **_dest_01;
  aiScene *paVar19;
  aiMaterial *paVar20;
  Logger *pLVar21;
  aiMesh **_dest_02;
  aiAnimation **_dest_03;
  aiAnimation *paVar22;
  size_t sVar23;
  uint uVar24;
  ulong uVar25;
  uint uVar26;
  int iVar27;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *hashes;
  char *pcVar28;
  pointer pNVar29;
  ulong uVar30;
  pointer pSVar31;
  char *pcVar32;
  aiCamera **ppaVar33;
  ulong uVar34;
  aiNode *src_00;
  aiLight **_dest_04;
  int iVar35;
  ulong uVar36;
  bool bVar37;
  vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_> src;
  vector<unsigned_int,_std::allocator<unsigned_int>_> duplicates;
  vector<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_> nodes;
  vector<unsigned_int,_std::allocator<unsigned_int>_> offset;
  aiNode *node;
  vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_> local_288;
  pointer local_270;
  char *local_268;
  aiScene *local_260;
  ulong local_258;
  aiCamera **local_250;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_248;
  vector<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_> *local_230;
  vector<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_> local_228;
  aiLight **local_210;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_208;
  aiScene *local_1f0;
  ulong local_1e8;
  aiAnimation **local_1e0;
  aiNode *local_1d8 [2];
  undefined1 local_1c8 [32];
  NodeAttachmentInfo local_1a8;
  char acStack_188 [4];
  uint uStack_184;
  char local_180 [8];
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_178;
  ios_base local_138 [264];
  
  if (_dest != (aiScene **)0x0) {
    paVar17 = *_dest;
    if ((srcList->
        super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>)._M_impl
        .super__Vector_impl_data._M_start ==
        (srcList->
        super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>)._M_impl
        .super__Vector_impl_data._M_finish) {
      if (paVar17 != (aiScene *)0x0) {
        CopySceneFlat(_dest,master);
        return;
      }
      *_dest = master;
    }
    else {
      local_230 = srcList;
      if (paVar17 == (aiScene *)0x0) {
        paVar17 = (aiScene *)operator_new(0x80);
        aiScene::aiScene(paVar17);
        *_dest = paVar17;
        srcList = local_230;
      }
      else {
        aiScene::~aiScene(paVar17);
        aiScene::aiScene(*_dest);
      }
      local_260 = *_dest;
      std::vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>::vector
                (&local_288,
                 ((long)(srcList->
                        super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(srcList->
                        super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 4) + 1,
                 (allocator_type *)&local_1a8);
      (local_288.super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>.
       _M_impl.super__Vector_impl_data._M_start)->scene = master;
      pAVar18 = (srcList->
                super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>)
                ._M_impl.super__Vector_impl_data._M_start;
      local_1f0 = master;
      if ((srcList->
          super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>).
          _M_impl.super__Vector_impl_data._M_finish != pAVar18) {
        p_Var1 = &local_178._M_impl.super__Rb_tree_header;
        uVar25 = 1;
        uVar30 = 0;
        do {
          uVar36 = uVar25;
          pSVar12 = local_288.
                    super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          local_1a8.node = (aiNode *)pAVar18[uVar30].scene;
          local_180[0] = '\0';
          local_180[1] = '\0';
          local_180[2] = '\0';
          local_180[3] = '\0';
          local_178._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_178._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_178._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_1a8.attachToNode = (aiNode *)((ulong)local_1a8.attachToNode & 0xffffffffffffff00);
          pSVar31 = local_288.
                    super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>.
                    _M_impl.super__Vector_impl_data._M_start + uVar36;
          *(ulong *)(pSVar31->id + 8) = CONCAT71(local_1a8._17_7_,local_1a8.resolved);
          *(ulong *)(pSVar31->id + 0x10) = CONCAT44(local_1a8.src_idx._4_4_,(uint)local_1a8.src_idx)
          ;
          *(ulong *)(pSVar31->id + 0x14) = CONCAT44(acStack_188,local_1a8.src_idx._4_4_);
          *(ulong *)(pSVar31->id + 0x1c) = (ulong)uStack_184;
          pSVar31->scene = (aiScene *)local_1a8.node;
          *(aiNode **)pSVar31->id = local_1a8.attachToNode;
          local_178._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
          local_178._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
          std::
          _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
          ::clear(&(pSVar31->hashes)._M_t);
          if (local_178._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
            pSVar12[uVar36].hashes._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
                 local_178._M_impl.super__Rb_tree_header._M_header._M_color;
            pSVar12[uVar36].hashes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 local_178._M_impl.super__Rb_tree_header._M_header._M_parent;
            pSVar12[uVar36].hashes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 local_178._M_impl.super__Rb_tree_header._M_header._M_left;
            pSVar12[uVar36].hashes._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 local_178._M_impl.super__Rb_tree_header._M_header._M_right;
            (local_178._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
                 &pSVar12[uVar36].hashes._M_t._M_impl.super__Rb_tree_header._M_header;
            pSVar12[uVar36].hashes._M_t._M_impl.super__Rb_tree_header._M_node_count =
                 local_178._M_impl.super__Rb_tree_header._M_node_count;
            local_178._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            local_178._M_impl.super__Rb_tree_header._M_node_count = 0;
            local_178._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
            local_178._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
          }
          std::
          _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
          ::~_Rb_tree(&local_178);
          pAVar18 = (local_230->
                    super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          uVar25 = (ulong)((int)uVar36 + 1);
          uVar30 = uVar36;
        } while (uVar36 < (ulong)((long)(local_230->
                                        super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>
                                        )._M_impl.super__Vector_impl_data._M_finish - (long)pAVar18
                                 >> 4));
      }
      local_1a8.node = (aiNode *)CONCAT44(local_1a8.node._4_4_,0xffffffff);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&local_248,
                 ((long)local_288.
                        super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_288.
                        super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x5555555555555555,
                 (value_type_conflict4 *)&local_1a8,(allocator_type *)local_1d8);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&local_208,
                 ((long)local_288.
                        super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_288.
                        super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x5555555555555555,
                 (allocator_type *)&local_1a8);
      if (local_288.super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          local_288.super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        uVar30 = 0;
        uVar25 = 2;
        do {
          uVar14 = (uint)uVar30;
          iVar16 = (int)uVar25;
          if (local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar30] == uVar14 ||
              local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar30] == 0xffffffff) {
            local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar30] = uVar14;
            uVar36 = (ulong)(uVar14 + 1);
            uVar34 = ((long)local_288.
                            super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_288.
                            super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x5555555555555555;
            if (uVar36 <= uVar34 && uVar34 - uVar36 != 0) {
              do {
                if (local_288.
                    super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar30].scene ==
                    local_288.
                    super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar36].scene) {
                  local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar36] = uVar14;
                }
                uVar36 = ((long)local_288.
                                super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_288.
                                super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 5) *
                         -0x5555555555555555;
                bVar37 = uVar25 <= uVar36;
                lVar10 = uVar36 - uVar25;
                uVar36 = uVar25;
                uVar25 = (ulong)((int)uVar25 + 1);
              } while (bVar37 && lVar10 != 0);
            }
          }
          uVar30 = (ulong)(uVar14 + 1);
          uVar36 = ((long)local_288.
                          super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_288.
                          super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x5555555555555555;
          uVar25 = (ulong)(iVar16 + 1);
        } while (uVar30 <= uVar36 && uVar36 - uVar30 != 0);
      }
      if (((flags & 1) != 0) &&
         (1 < (ulong)(((long)local_288.
                             super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_288.
                             super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x5555555555555555))
         ) {
        uVar25 = 1;
        do {
          uVar14 = snprintf(local_288.
                            super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar25].id,0x20,"$%.6X$_",
                            uVar25);
          local_288.super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar25].idlen = uVar14;
          if ((flags & 0x10) != 0) {
            AddNodeHashes((SceneCombiner *)
                          (local_288.
                           super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar25].scene)->mRootNode,
                          (aiNode *)
                          &local_288.
                           super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar25].hashes,hashes);
            paVar17 = local_288.
                      super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar25].scene;
            if (paVar17->mNumAnimations != 0) {
              uVar30 = 0;
              do {
                pSVar31 = local_288.
                          super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar25;
                uVar15 = SuperFastHash((paVar17->mAnimations[uVar30]->mName).data,
                                       (paVar17->mAnimations[uVar30]->mName).length,0);
                local_1a8.node = (aiNode *)CONCAT44(local_1a8.node._4_4_,uVar15);
                std::
                _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                ::_M_insert_unique<unsigned_int>(&(pSVar31->hashes)._M_t,(uint *)&local_1a8);
                uVar30 = uVar30 + 1;
                paVar17 = local_288.
                          super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar25].scene;
              } while (uVar30 < paVar17->mNumAnimations);
            }
          }
          uVar25 = (ulong)((int)uVar25 + 1);
          uVar30 = ((long)local_288.
                          super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_288.
                          super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x5555555555555555;
        } while (uVar25 <= uVar30 && uVar30 - uVar25 != 0);
      }
      paVar17 = local_260;
      if (local_288.super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          local_288.super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        uVar14 = local_260->mNumAnimations;
        uVar24 = local_260->mNumLights;
        uVar26 = local_260->mNumCameras;
        uVar25 = 0;
        do {
          pSVar31 = local_288.
                    super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>.
                    _M_impl.super__Vector_impl_data._M_start + uVar25;
          if (((flags & 4) != 0) ||
             ((uint)uVar25 ==
              local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar25])) {
            local_260->mNumTextures = local_260->mNumTextures + pSVar31->scene->mNumTextures;
            local_260->mNumMaterials = local_260->mNumMaterials + pSVar31->scene->mNumMaterials;
            local_260->mNumMeshes = local_260->mNumMeshes + pSVar31->scene->mNumMeshes;
          }
          uVar24 = uVar24 + pSVar31->scene->mNumLights;
          local_260->mNumLights = uVar24;
          uVar26 = uVar26 + pSVar31->scene->mNumCameras;
          local_260->mNumCameras = uVar26;
          uVar14 = uVar14 + pSVar31->scene->mNumAnimations;
          local_260->mNumAnimations = uVar14;
          if ((pSVar31->scene->mFlags & 8) != 0) {
            *(byte *)&local_260->mFlags = (byte)local_260->mFlags | 8;
          }
          uVar25 = (ulong)((uint)uVar25 + 1);
          uVar30 = ((long)local_288.
                          super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_288.
                          super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x5555555555555555;
        } while (uVar25 <= uVar30 && uVar30 - uVar25 != 0);
      }
      if (local_260->mNumTextures != 0) {
        _dest_00 = (aiTexture **)operator_new__((ulong)local_260->mNumMaterials << 3);
        paVar17->mTextures = _dest_00;
        if (local_288.super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            local_288.super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          uVar25 = 0;
          uVar30 = 0;
          do {
            paVar17 = local_288.
                      super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar25].scene;
            if (paVar17->mNumTextures != 0) {
              pSVar31 = local_288.
                        super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar25;
              uVar36 = 0;
              do {
                if ((uint)uVar25 ==
                    local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar25]) {
                  *_dest_00 = paVar17->mTextures[uVar36];
LAB_0039da09:
                  _dest_00 = _dest_00 + 1;
                }
                else if ((flags & 4) != 0) {
                  Copy(_dest_00,paVar17->mTextures[uVar36]);
                  goto LAB_0039da09;
                }
                uVar36 = uVar36 + 1;
                paVar17 = pSVar31->scene;
              } while (uVar36 < paVar17->mNumTextures);
            }
            local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar25] = (uint)uVar30;
            uVar30 = (ulong)((long)_dest_00 - (long)local_260->mTextures) >> 3;
            uVar25 = (ulong)((uint)uVar25 + 1);
            uVar36 = ((long)local_288.
                            super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_288.
                            super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x5555555555555555;
          } while (uVar25 <= uVar36 && uVar36 - uVar25 != 0);
        }
      }
      paVar17 = local_260;
      if ((ulong)local_260->mNumMaterials != 0) {
        _dest_01 = (aiMaterial **)operator_new__((ulong)local_260->mNumMaterials << 3);
        paVar17->mMaterials = _dest_01;
        if (local_288.super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            local_288.super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          uVar25 = 0;
          ppaVar33 = (aiCamera **)0x0;
          do {
            paVar19 = local_288.
                      super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar25].scene;
            local_250 = ppaVar33;
            if (paVar19->mNumMaterials != 0) {
              pSVar31 = local_288.
                        super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar25;
              local_268 = pSVar31->id;
              uVar30 = 0;
              local_270 = pSVar31;
              local_258 = uVar25;
              do {
                if ((uint)uVar25 ==
                    local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar25]) {
                  *_dest_01 = paVar19->mMaterials[uVar30];
LAB_0039db01:
                  if ((pSVar31->scene->mNumTextures != paVar17->mNumTextures) &&
                     (paVar20 = *_dest_01, paVar20->mNumProperties != 0)) {
                    uVar25 = 0;
                    do {
                      paVar3 = paVar20->mProperties[uVar25];
                      pcVar32 = (paVar3->mKey).data;
                      iVar16 = strncmp(pcVar32,"$tex.file",9);
                      if (iVar16 == 0) {
                        pcVar32 = paVar3->mData;
                        if (pcVar32[4] == '*') {
                          cVar13 = pcVar32[5];
                          iVar16 = 0;
                          if (0xf5 < (byte)(cVar13 - 0x3aU)) {
                            pcVar28 = pcVar32 + 6;
                            iVar16 = 0;
                            do {
                              iVar16 = (uint)(byte)(cVar13 - 0x30) + iVar16 * 10;
                              cVar13 = *pcVar28;
                              pcVar28 = pcVar28 + 1;
                            } while (0xf5 < (byte)(cVar13 - 0x3aU));
                          }
                          iVar16 = iVar16 + local_208.
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_start[local_258];
                          if (iVar16 < 0) {
                            pcVar32[5] = '-';
                            pcVar32 = pcVar32 + 6;
                            iVar16 = -iVar16;
                            uVar14 = 2;
                          }
                          else {
                            pcVar32 = pcVar32 + 5;
                            uVar14 = 1;
                          }
                          iVar35 = 1000000000;
                          bVar37 = false;
                          do {
                            if (0x3fe < uVar14) break;
                            iVar27 = iVar16 % iVar35;
                            if (((bVar37) || (iVar35 == 1)) ||
                               ((int)((long)iVar16 / (long)iVar35) != 0)) {
                              pcVar28 = pcVar32 + 1;
                              uVar14 = uVar14 + 1;
                              *pcVar32 = (char)((long)iVar16 / (long)iVar35) + '0';
                              bVar37 = true;
                              pcVar32 = pcVar28;
                              iVar16 = iVar27;
                              if (iVar35 != 1) goto LAB_0039dc9e;
                              bVar11 = false;
                              iVar35 = 1;
                            }
                            else {
LAB_0039dc9e:
                              iVar35 = iVar35 / 10;
                              bVar11 = true;
                            }
                          } while (bVar11);
                          *pcVar32 = '\0';
                        }
                      }
                      else {
                        iVar16 = strcmp(pcVar32,"$mat.name");
                        if (((flags & 2) != 0) && (iVar16 == 0)) {
                          piVar4 = (int *)paVar3->mData;
                          uVar14 = local_270->idlen;
                          iVar16 = *piVar4;
                          if ((iVar16 == 0) || ((char)piVar4[1] != '$')) {
                            if (iVar16 + uVar14 < 0x3ff) {
                              __src = piVar4 + 1;
                              memmove((void *)((long)__src + (ulong)uVar14),__src,
                                      (ulong)(iVar16 + 1));
                              memcpy(__src,local_268,(ulong)uVar14);
                              *piVar4 = *piVar4 + uVar14;
                            }
                            else {
                              pLVar21 = DefaultLogger::get();
                              Logger::debug(pLVar21,
                                            "Can\'t add an unique prefix because the string is too long"
                                           );
                            }
                          }
                        }
                      }
                      uVar25 = uVar25 + 1;
                      paVar20 = *_dest_01;
                    } while (uVar25 < paVar20->mNumProperties);
                  }
                  _dest_01 = _dest_01 + 1;
                  uVar25 = local_258;
                  pSVar31 = local_270;
                  paVar17 = local_260;
                }
                else if ((flags & 4) != 0) {
                  Copy(_dest_01,paVar19->mMaterials[uVar30]);
                  goto LAB_0039db01;
                }
                uVar30 = uVar30 + 1;
                paVar19 = pSVar31->scene;
              } while (uVar30 < paVar19->mNumMaterials);
            }
            local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar25] = (uint)local_250;
            ppaVar33 = (aiCamera **)((ulong)((long)_dest_01 - (long)paVar17->mMaterials) >> 3);
            uVar25 = (ulong)((int)uVar25 + 1);
            uVar30 = ((long)local_288.
                            super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_288.
                            super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x5555555555555555;
          } while (uVar25 <= uVar30 && uVar30 - uVar25 != 0);
        }
      }
      if ((ulong)paVar17->mNumMeshes != 0) {
        _dest_02 = (aiMesh **)operator_new__((ulong)paVar17->mNumMeshes << 3);
        local_260->mMeshes = _dest_02;
        if (local_288.super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            local_288.super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          uVar25 = 0;
          uVar30 = 0;
          do {
            paVar17 = local_288.
                      super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar25].scene;
            if (paVar17->mNumMeshes != 0) {
              pSVar31 = local_288.
                        super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar25;
              uVar36 = 0;
              do {
                if ((uint)uVar25 ==
                    local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar25]) {
                  *_dest_02 = paVar17->mMeshes[uVar36];
LAB_0039ddc8:
                  (*_dest_02)->mMaterialIndex =
                       (*_dest_02)->mMaterialIndex +
                       local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar25];
                  _dest_02 = _dest_02 + 1;
                }
                else if ((flags & 4) != 0) {
                  Copy(_dest_02,paVar17->mMeshes[uVar36]);
                  goto LAB_0039ddc8;
                }
                uVar36 = uVar36 + 1;
                paVar17 = pSVar31->scene;
              } while (uVar36 < paVar17->mNumMeshes);
            }
            local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar25] = (uint)uVar30;
            uVar30 = (ulong)((long)_dest_02 - (long)local_260->mMeshes) >> 3;
            uVar25 = (ulong)((uint)uVar25 + 1);
            uVar36 = ((long)local_288.
                            super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_288.
                            super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x5555555555555555;
          } while (uVar25 <= uVar36 && uVar36 - uVar25 != 0);
        }
      }
      local_228.
      super__Vector_base<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>.
      _M_impl.super__Vector_impl_data._M_start = (NodeAttachmentInfo *)0x0;
      local_228.
      super__Vector_base<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>.
      _M_impl.super__Vector_impl_data._M_finish = (NodeAttachmentInfo *)0x0;
      local_228.
      super__Vector_base<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (NodeAttachmentInfo *)0x0;
      std::vector<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>::reserve
                (&local_228,
                 (long)(local_230->
                       super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(local_230->
                       super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>
                       )._M_impl.super__Vector_impl_data._M_start >> 4);
      paVar17 = local_260;
      if ((ulong)local_260->mNumLights == 0) {
        local_210 = (aiLight **)0x0;
      }
      else {
        local_210 = (aiLight **)operator_new__((ulong)local_260->mNumLights << 3);
      }
      paVar17->mLights = local_210;
      if ((ulong)paVar17->mNumCameras == 0) {
        ppaVar33 = (aiCamera **)0x0;
      }
      else {
        ppaVar33 = (aiCamera **)operator_new__((ulong)paVar17->mNumCameras << 3);
      }
      paVar17->mCameras = ppaVar33;
      if ((ulong)paVar17->mNumAnimations == 0) {
        _dest_03 = (aiAnimation **)0x0;
      }
      else {
        _dest_03 = (aiAnimation **)operator_new__((ulong)paVar17->mNumAnimations << 3);
      }
      paVar17->mAnimations = _dest_03;
      uVar14 = (int)((long)local_288.
                           super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_288.
                           super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x55555555;
      uVar24 = uVar14 - 1;
      if (-1 < (int)uVar24) {
        local_1e8 = (ulong)uVar14;
        uVar25 = (ulong)uVar24;
        do {
          pSVar31 = local_288.
                    super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          src_00 = (local_288.
                    super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar25].scene)->mRootNode;
          local_250 = ppaVar33;
          local_1e0 = _dest_03;
          if (uVar25 == local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar25]) {
            uVar14 = local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar25];
            local_1d8[0] = src_00;
LAB_0039df9e:
            OffsetNodeMeshIndices(src_00,uVar14);
          }
          else {
            Copy(local_1d8,src_00);
            src_00 = local_1d8[0];
            OffsetNodeMeshIndices
                      (local_1d8[0],
                       local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start
                       [local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar25]]);
            if ((flags & 4) != 0) {
              uVar14 = local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar25] -
                       local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start
                       [local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar25]];
              goto LAB_0039df9e;
            }
          }
          uVar14 = (uint)local_1a8.src_idx;
          uVar30 = uVar25 - 1;
          local_1a8.src_idx._0_4_ = (uint)uVar25;
          uVar24 = (uint)local_1a8.src_idx;
          if (uVar25 != 0) {
            local_1a8.attachToNode =
                 (local_230->
                 super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>
                 )._M_impl.super__Vector_impl_data._M_start[(int)local_1e8 - 2].attachToNode;
            local_1a8.node = local_1d8[0];
            local_1a8.resolved = false;
            local_1a8.src_idx._4_4_ = (undefined4)(uVar25 >> 0x20);
            if (local_228.
                super__Vector_base<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>
                ._M_impl.super__Vector_impl_data._M_finish ==
                local_228.
                super__Vector_base<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>::
              _M_realloc_insert<Assimp::NodeAttachmentInfo>
                        (&local_228,
                         (iterator)
                         local_228.
                         super__Vector_base<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>
                         ._M_impl.super__Vector_impl_data._M_finish,&local_1a8);
              uVar14 = (uint)local_1a8.src_idx;
            }
            else {
              *(ulong *)&(local_228.
                          super__Vector_base<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish)->resolved =
                   (ulong)(uint7)local_1a8._17_7_ << 8;
              (local_228.
               super__Vector_base<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish)->src_idx = uVar25;
              (local_228.
               super__Vector_base<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish)->node = local_1d8[0];
              (local_228.
               super__Vector_base<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish)->attachToNode = local_1a8.attachToNode;
              local_228.
              super__Vector_base<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   local_228.
                   super__Vector_base<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 1;
              uVar14 = (uint)local_1a8.src_idx;
            }
          }
          local_1a8.src_idx._0_4_ = uVar14;
          pSVar31 = pSVar31 + uVar25;
          local_270 = pSVar31;
          local_258 = uVar25;
          local_1c8._16_8_ = uVar30;
          if ((flags & 1) != 0) {
            local_268 = pSVar31->id;
            if ((flags & 0x10) == 0) {
              AddNodePrefixes(local_1d8[0],local_268,pSVar31->idlen);
            }
            else {
              AddNodePrefixesChecked(local_1d8[0],local_268,pSVar31->idlen,&local_288,uVar24);
            }
            paVar17 = pSVar31->scene;
            if (paVar17->mNumMeshes != 0) {
              uVar25 = 0;
              do {
                paVar5 = paVar17->mMeshes[uVar25];
                if (paVar5->mNumBones != 0) {
                  uVar30 = 0;
                  do {
                    if (((flags & 0x10) == 0) ||
                       (bVar37 = FindNameMatch(&paVar5->mBones[uVar30]->mName,&local_288,
                                               (uint)local_258), bVar37)) {
                      paVar6 = paVar5->mBones[uVar30];
                      uVar14 = local_270->idlen;
                      aVar2 = (paVar6->mName).length;
                      if ((aVar2 == 0) || ((paVar6->mName).data[0] != '$')) {
                        if (aVar2 + uVar14 < 0x3ff) {
                          pcVar32 = (paVar6->mName).data;
                          memmove(pcVar32 + uVar14,pcVar32,(ulong)(aVar2 + 1));
                          memcpy(pcVar32,local_268,(ulong)uVar14);
                          (paVar6->mName).length = (paVar6->mName).length + uVar14;
                        }
                        else {
                          pLVar21 = DefaultLogger::get();
                          Logger::debug(pLVar21,
                                        "Can\'t add an unique prefix because the string is too long"
                                       );
                        }
                      }
                    }
                    uVar30 = uVar30 + 1;
                  } while (uVar30 < paVar5->mNumBones);
                }
                uVar25 = uVar25 + 1;
                paVar17 = local_270->scene;
                pSVar31 = local_270;
              } while (uVar25 < paVar17->mNumMeshes);
            }
          }
          ppaVar33 = local_250;
          uVar30 = local_258;
          paVar17 = pSVar31->scene;
          uVar14 = (uint)local_258;
          _dest_04 = local_210;
          if (paVar17->mNumLights != 0) {
            local_1c8._24_8_ = pSVar31->id;
            uVar25 = 0;
            do {
              if (uVar30 == local_248.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar30]) {
                *_dest_04 = paVar17->mLights[uVar25];
              }
              else {
                Copy(_dest_04,paVar17->mLights[uVar25]);
              }
              if (((flags & 1) != 0) &&
                 (((flags & 0x10) == 0 ||
                  (bVar37 = FindNameMatch(&(*_dest_04)->mName,&local_288,uVar14), bVar37)))) {
                paVar7 = *_dest_04;
                uVar24 = local_270->idlen;
                aVar2 = (paVar7->mName).length;
                if ((aVar2 == 0) || ((paVar7->mName).data[0] != '$')) {
                  if (aVar2 + uVar24 < 0x3ff) {
                    pcVar32 = (paVar7->mName).data;
                    local_268 = (char *)(ulong)uVar24;
                    memmove((char *)(ulong)uVar24 + (long)pcVar32,pcVar32,(ulong)(aVar2 + 1));
                    memcpy(pcVar32,(void *)local_1c8._24_8_,(size_t)local_268);
                    (paVar7->mName).length = (paVar7->mName).length + (int)local_268;
                  }
                  else {
                    pLVar21 = DefaultLogger::get();
                    Logger::debug(pLVar21,
                                  "Can\'t add an unique prefix because the string is too long");
                  }
                }
              }
              uVar25 = uVar25 + 1;
              _dest_04 = _dest_04 + 1;
              paVar17 = local_270->scene;
            } while (uVar25 < paVar17->mNumLights);
          }
          paVar17 = local_270->scene;
          local_210 = _dest_04;
          if (paVar17->mNumCameras != 0) {
            local_268 = local_270->id;
            uVar25 = 0;
            do {
              if (uVar30 == local_248.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar30]) {
                *ppaVar33 = paVar17->mCameras[uVar25];
              }
              else {
                Copy(ppaVar33,paVar17->mCameras[uVar25]);
              }
              if (((flags & 1) != 0) &&
                 (((flags & 0x10) == 0 ||
                  (bVar37 = FindNameMatch(&(*ppaVar33)->mName,&local_288,uVar14), bVar37)))) {
                paVar8 = *ppaVar33;
                uVar24 = local_270->idlen;
                aVar2 = (paVar8->mName).length;
                if ((aVar2 == 0) || ((paVar8->mName).data[0] != '$')) {
                  if (aVar2 + uVar24 < 0x3ff) {
                    pcVar32 = (paVar8->mName).data;
                    memmove(pcVar32 + uVar24,pcVar32,(ulong)(aVar2 + 1));
                    memcpy(pcVar32,local_268,(ulong)uVar24);
                    (paVar8->mName).length = (paVar8->mName).length + uVar24;
                  }
                  else {
                    pLVar21 = DefaultLogger::get();
                    Logger::debug(pLVar21,
                                  "Can\'t add an unique prefix because the string is too long");
                  }
                }
              }
              uVar25 = uVar25 + 1;
              ppaVar33 = ppaVar33 + 1;
              paVar17 = local_270->scene;
            } while (uVar25 < paVar17->mNumCameras);
          }
          paVar17 = local_270->scene;
          _dest_03 = local_1e0;
          if (paVar17->mNumAnimations != 0) {
            local_268 = local_270->id;
            uVar25 = 0;
            local_250 = ppaVar33;
            do {
              if (uVar30 == local_248.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar30]) {
                *_dest_03 = paVar17->mAnimations[uVar25];
              }
              else {
                Copy(_dest_03,paVar17->mAnimations[uVar25]);
              }
              if (((flags & 1) != 0) &&
                 (((flags & 0x10) == 0 ||
                  (bVar37 = FindNameMatch(&(*_dest_03)->mName,&local_288,(uint)local_258), bVar37)))
                 ) {
                paVar22 = *_dest_03;
                uVar14 = local_270->idlen;
                aVar2 = (paVar22->mName).length;
                if ((aVar2 == 0) || ((paVar22->mName).data[0] != '$')) {
                  if (aVar2 + uVar14 < 0x3ff) {
                    pcVar32 = (paVar22->mName).data;
                    memmove(pcVar32 + uVar14,pcVar32,(ulong)(aVar2 + 1));
                    memcpy(pcVar32,local_268,(ulong)uVar14);
                    (paVar22->mName).length = (paVar22->mName).length + uVar14;
                  }
                  else {
                    pLVar21 = DefaultLogger::get();
                    Logger::debug(pLVar21,
                                  "Can\'t add an unique prefix because the string is too long");
                  }
                }
                paVar22 = *_dest_03;
                if (paVar22->mNumChannels != 0) {
                  uVar30 = 0;
                  do {
                    if (((flags & 0x10) == 0) ||
                       (bVar37 = FindNameMatch(&paVar22->mChannels[uVar30]->mNodeName,&local_288,
                                               (uint)local_258), bVar37)) {
                      paVar9 = (*_dest_03)->mChannels[uVar30];
                      uVar14 = local_270->idlen;
                      aVar2 = (paVar9->mNodeName).length;
                      if ((aVar2 == 0) || ((paVar9->mNodeName).data[0] != '$')) {
                        if (aVar2 + uVar14 < 0x3ff) {
                          pcVar32 = (paVar9->mNodeName).data;
                          memmove(pcVar32 + uVar14,pcVar32,(ulong)(aVar2 + 1));
                          memcpy(pcVar32,local_268,(ulong)uVar14);
                          (paVar9->mNodeName).length = (paVar9->mNodeName).length + uVar14;
                        }
                        else {
                          pLVar21 = DefaultLogger::get();
                          Logger::debug(pLVar21,
                                        "Can\'t add an unique prefix because the string is too long"
                                       );
                        }
                      }
                    }
                    uVar30 = uVar30 + 1;
                    paVar22 = *_dest_03;
                  } while (uVar30 < paVar22->mNumChannels);
                }
              }
              uVar25 = uVar25 + 1;
              _dest_03 = _dest_03 + 1;
              paVar17 = local_270->scene;
              uVar30 = local_258;
              ppaVar33 = local_250;
            } while (uVar25 < paVar17->mNumAnimations);
          }
          local_1e8 = local_1e8 - 1;
          uVar25 = local_1c8._16_8_;
        } while (0 < (long)uVar30);
      }
      AttachToGraph(local_1f0->mRootNode,&local_228);
      local_260->mRootNode = local_1f0->mRootNode;
      if (local_228.
          super__Vector_base<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_228.
          super__Vector_base<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pNVar29 = local_228.
                  super__Vector_base<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          if (pNVar29->resolved == false) {
            if (((flags & 8) != 0) &&
               (local_288.
                super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>.
                _M_impl.super__Vector_impl_data._M_finish !=
                local_288.
                super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>.
                _M_impl.super__Vector_impl_data._M_start)) {
              uVar25 = 0;
              uVar30 = 1;
              do {
                if ((pNVar29->src_idx != uVar25) &&
                   (AttachToGraph((local_288.
                                   super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                                   ._M_impl.super__Vector_impl_data._M_start[uVar25].scene)->
                                  mRootNode,&local_228), pNVar29->resolved != false)) break;
                uVar25 = ((long)local_288.
                                super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_288.
                                super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 5) *
                         -0x5555555555555555;
                bVar37 = uVar30 <= uVar25;
                lVar10 = uVar25 - uVar30;
                uVar25 = uVar30;
                uVar30 = (ulong)((int)uVar30 + 1);
              } while (bVar37 && lVar10 != 0);
            }
            if (pNVar29->resolved == false) {
              pLVar21 = DefaultLogger::get();
              Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
              basic_formatter<char[45]>
                        ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_1a8,(char (*) [45])"SceneCombiner: Failed to resolve attachment ");
              pcVar32 = (pNVar29->node->mName).data;
              sVar23 = strlen(pcVar32);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_1a8,pcVar32,sVar23);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," ",1);
              pcVar32 = (pNVar29->attachToNode->mName).data;
              sVar23 = strlen(pcVar32);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_1a8,pcVar32,sVar23);
              std::__cxx11::stringbuf::str();
              Logger::error(pLVar21,(char *)local_1d8[0]);
              if (local_1d8[0] != (aiNode *)local_1c8) {
                operator_delete(local_1d8[0]);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
              std::ios_base::~ios_base(local_138);
            }
          }
          pNVar29 = pNVar29 + 1;
        } while (pNVar29 !=
                 local_228.
                 super__Vector_base<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      if (local_288.super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          local_288.super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        uVar25 = 0;
        do {
          if ((uint)uVar25 ==
              local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar25]) {
            paVar17 = local_288.
                      super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar25].scene;
            if (paVar17->mMeshes != (aiMesh **)0x0) {
              operator_delete__(paVar17->mMeshes);
            }
            paVar17->mMeshes = (aiMesh **)0x0;
            if (paVar17->mCameras != (aiCamera **)0x0) {
              operator_delete__(paVar17->mCameras);
            }
            paVar17->mCameras = (aiCamera **)0x0;
            if (paVar17->mLights != (aiLight **)0x0) {
              operator_delete__(paVar17->mLights);
            }
            paVar17->mLights = (aiLight **)0x0;
            if (paVar17->mMaterials != (aiMaterial **)0x0) {
              operator_delete__(paVar17->mMaterials);
            }
            paVar17->mMaterials = (aiMaterial **)0x0;
            if (paVar17->mAnimations != (aiAnimation **)0x0) {
              operator_delete__(paVar17->mAnimations);
            }
            paVar17->mAnimations = (aiAnimation **)0x0;
            paVar17->mRootNode = (aiNode *)0x0;
            if (paVar17 != (aiScene *)0x0) {
              aiScene::~aiScene(paVar17);
              operator_delete(paVar17);
            }
          }
          uVar25 = (ulong)((uint)uVar25 + 1);
          uVar30 = ((long)local_288.
                          super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_288.
                          super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x5555555555555555;
        } while (uVar25 <= uVar30 && uVar30 - uVar25 != 0);
      }
      if ((local_260->mNumMeshes == 0) || (local_260->mNumMaterials == 0)) {
        *(byte *)&local_260->mFlags = (byte)local_260->mFlags | 1;
      }
      if (local_228.
          super__Vector_base<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>
          ._M_impl.super__Vector_impl_data._M_start != (NodeAttachmentInfo *)0x0) {
        operator_delete(local_228.
                        super__Vector_base<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      std::vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>::~vector(&local_288);
    }
  }
  return;
}

Assistant:

void SceneCombiner::MergeScenes(aiScene** _dest, aiScene* master, std::vector<AttachmentInfo>& srcList, unsigned int flags) {
    if ( nullptr == _dest ) {
        return;
    }

    // if _dest points to NULL allocate a new scene. Otherwise clear the old and reuse it
    if (srcList.empty())    {
        if (*_dest) {
            SceneCombiner::CopySceneFlat(_dest,master);
        }
        else *_dest = master;
        return;
    }
    if (*_dest) {
        (*_dest)->~aiScene();
        new (*_dest) aiScene();
    }
    else *_dest = new aiScene();

    aiScene* dest = *_dest;

    std::vector<SceneHelper> src (srcList.size()+1);
    src[0].scene = master;
    for (unsigned int i = 0; i < srcList.size();++i)    {
        src[i+1] = SceneHelper( srcList[i].scene );
    }

    // this helper array specifies which scenes are duplicates of others
    std::vector<unsigned int> duplicates(src.size(),UINT_MAX);

    // this helper array is used as lookup table several times
    std::vector<unsigned int> offset(src.size());

    // Find duplicate scenes
    for (unsigned int i = 0; i < src.size();++i) {
        if (duplicates[i] != i && duplicates[i] != UINT_MAX) {
            continue;
        }

        duplicates[i] = i;
        for ( unsigned int a = i+1; a < src.size(); ++a)    {
            if (src[i].scene == src[a].scene) {
                duplicates[a] = i;
            }
        }
    }

    // Generate unique names for all named stuff?
    if (flags & AI_INT_MERGE_SCENE_GEN_UNIQUE_NAMES)
    {
#if 0
        // Construct a proper random number generator
        boost::mt19937 rng(  );
        boost::uniform_int<> dist(1u,1 << 24u);
        boost::variate_generator<boost::mt19937&, boost::uniform_int<> > rndGen(rng, dist);
#endif
        for (unsigned int i = 1; i < src.size();++i)
        {
            //if (i != duplicates[i])
            //{
            //  // duplicate scenes share the same UID
            //  ::strcpy( src[i].id, src[duplicates[i]].id );
            //  src[i].idlen = src[duplicates[i]].idlen;

            //  continue;
            //}

            src[i].idlen = ai_snprintf(src[i].id, 32, "$%.6X$_",i);

            if (flags & AI_INT_MERGE_SCENE_GEN_UNIQUE_NAMES_IF_NECESSARY) {

                // Compute hashes for all identifiers in this scene and store them
                // in a sorted table (for convenience I'm using std::set). We hash
                // just the node and animation channel names, all identifiers except
                // the material names should be caught by doing this.
                AddNodeHashes(src[i]->mRootNode,src[i].hashes);

                for (unsigned int a = 0; a < src[i]->mNumAnimations;++a) {
                    aiAnimation* anim = src[i]->mAnimations[a];
                    src[i].hashes.insert(SuperFastHash(anim->mName.data,static_cast<uint32_t>(anim->mName.length)));
                }
            }
        }
    }

    unsigned int cnt;

    // First find out how large the respective output arrays must be
    for ( unsigned int n = 0; n < src.size();++n )
    {
        SceneHelper* cur = &src[n];

        if (n == duplicates[n] || flags & AI_INT_MERGE_SCENE_DUPLICATES_DEEP_CPY)   {
            dest->mNumTextures   += (*cur)->mNumTextures;
            dest->mNumMaterials  += (*cur)->mNumMaterials;
            dest->mNumMeshes     += (*cur)->mNumMeshes;
        }

        dest->mNumLights     += (*cur)->mNumLights;
        dest->mNumCameras    += (*cur)->mNumCameras;
        dest->mNumAnimations += (*cur)->mNumAnimations;

        // Combine the flags of all scenes
        // We need to process them flag-by-flag here to get correct results
        // dest->mFlags ; //|= (*cur)->mFlags;
        if ((*cur)->mFlags & AI_SCENE_FLAGS_NON_VERBOSE_FORMAT) {
            dest->mFlags |= AI_SCENE_FLAGS_NON_VERBOSE_FORMAT;
        }
    }

    // generate the output texture list + an offset table for all texture indices
    if (dest->mNumTextures)
    {
        aiTexture** pip = dest->mTextures = new aiTexture*[dest->mNumMaterials];
        cnt = 0;
        for ( unsigned int n = 0; n < src.size();++n )
        {
            SceneHelper* cur = &src[n];
            for (unsigned int i = 0; i < (*cur)->mNumTextures;++i)
            {
                if (n != duplicates[n])
                {
                    if ( flags & AI_INT_MERGE_SCENE_DUPLICATES_DEEP_CPY)
                        Copy(pip,(*cur)->mTextures[i]);

                    else continue;
                }
                else *pip = (*cur)->mTextures[i];
                ++pip;
            }

            offset[n] = cnt;
            cnt = (unsigned int)(pip - dest->mTextures);
        }
    }

    // generate the output material list + an offset table for all material indices
    if (dest->mNumMaterials)
    {
        aiMaterial** pip = dest->mMaterials = new aiMaterial*[dest->mNumMaterials];
        cnt = 0;
        for ( unsigned int n = 0; n < src.size();++n )  {
            SceneHelper* cur = &src[n];
            for (unsigned int i = 0; i < (*cur)->mNumMaterials;++i)
            {
                if (n != duplicates[n])
                {
                    if ( flags & AI_INT_MERGE_SCENE_DUPLICATES_DEEP_CPY)
                        Copy(pip,(*cur)->mMaterials[i]);

                    else continue;
                }
                else *pip = (*cur)->mMaterials[i];

                if ((*cur)->mNumTextures != dest->mNumTextures)     {
                    // We need to update all texture indices of the mesh. So we need to search for
                    // a material property called '$tex.file'

                    for (unsigned int a = 0; a < (*pip)->mNumProperties;++a)
                    {
                        aiMaterialProperty* prop = (*pip)->mProperties[a];
                        if (!strncmp(prop->mKey.data,"$tex.file",9))
                        {
                            // Check whether this texture is an embedded texture.
                            // In this case the property looks like this: *<n>,
                            // where n is the index of the texture.
                            aiString& s = *((aiString*)prop->mData);
                            if ('*' == s.data[0])   {
                                // Offset the index and write it back ..
                                const unsigned int idx = strtoul10(&s.data[1]) + offset[n];
                                ASSIMP_itoa10(&s.data[1],sizeof(s.data)-1,idx);
                            }
                        }

                        // Need to generate new, unique material names?
                        else if (!::strcmp( prop->mKey.data,"$mat.name" ) && flags & AI_INT_MERGE_SCENE_GEN_UNIQUE_MATNAMES)
                        {
                            aiString* pcSrc = (aiString*) prop->mData;
                            PrefixString(*pcSrc, (*cur).id, (*cur).idlen);
                        }
                    }
                }
                ++pip;
            }

            offset[n] = cnt;
            cnt = (unsigned int)(pip - dest->mMaterials);
        }
    }

    // generate the output mesh list + again an offset table for all mesh indices
    if (dest->mNumMeshes)
    {
        aiMesh** pip = dest->mMeshes = new aiMesh*[dest->mNumMeshes];
        cnt = 0;
        for ( unsigned int n = 0; n < src.size();++n )
        {
            SceneHelper* cur = &src[n];
            for (unsigned int i = 0; i < (*cur)->mNumMeshes;++i)
            {
                if (n != duplicates[n]) {
                    if ( flags & AI_INT_MERGE_SCENE_DUPLICATES_DEEP_CPY)
                        Copy(pip, (*cur)->mMeshes[i]);

                    else continue;
                }
                else *pip = (*cur)->mMeshes[i];

                // update the material index of the mesh
                (*pip)->mMaterialIndex +=  offset[n];
                ++pip;
            }

            // reuse the offset array - store now the mesh offset in it
            offset[n] = cnt;
            cnt = (unsigned int)(pip - dest->mMeshes);
        }
    }

    std::vector <NodeAttachmentInfo> nodes;
    nodes.reserve(srcList.size());

    // ----------------------------------------------------------------------------
    // Now generate the output node graph. We need to make those
    // names in the graph that are referenced by anims or lights
    // or cameras unique. So we add a prefix to them ... $<rand>_
    // We could also use a counter, but using a random value allows us to
    // use just one prefix if we are joining multiple scene hierarchies recursively.
    // Chances are quite good we don't collide, so we try that ...
    // ----------------------------------------------------------------------------

    // Allocate space for light sources, cameras and animations
    aiLight** ppLights = dest->mLights = (dest->mNumLights
        ? new aiLight*[dest->mNumLights] : NULL);

    aiCamera** ppCameras = dest->mCameras = (dest->mNumCameras
        ? new aiCamera*[dest->mNumCameras] : NULL);

    aiAnimation** ppAnims = dest->mAnimations = (dest->mNumAnimations
        ? new aiAnimation*[dest->mNumAnimations] : NULL);

    for ( int n = static_cast<int>(src.size()-1); n >= 0 ;--n ) /* !!! important !!! */
    {
        SceneHelper* cur = &src[n];
        aiNode* node;

        // To offset or not to offset, this is the question
        if (n != (int)duplicates[n])
        {
            // Get full scene-graph copy
            Copy( &node, (*cur)->mRootNode );
            OffsetNodeMeshIndices(node,offset[duplicates[n]]);

            if (flags & AI_INT_MERGE_SCENE_DUPLICATES_DEEP_CPY) {
                // (note:) they are already 'offseted' by offset[duplicates[n]]
                OffsetNodeMeshIndices(node,offset[n] - offset[duplicates[n]]);
            }
        }
        else // if (n == duplicates[n])
        {
            node = (*cur)->mRootNode;
            OffsetNodeMeshIndices(node,offset[n]);
        }
        if (n) // src[0] is the master node
            nodes.push_back(NodeAttachmentInfo( node,srcList[n-1].attachToNode,n ));

        // add name prefixes?
        if (flags & AI_INT_MERGE_SCENE_GEN_UNIQUE_NAMES) {

            // or the whole scenegraph
            if (flags & AI_INT_MERGE_SCENE_GEN_UNIQUE_NAMES_IF_NECESSARY) {
                AddNodePrefixesChecked(node,(*cur).id,(*cur).idlen,src,n);
            }
            else AddNodePrefixes(node,(*cur).id,(*cur).idlen);

            // meshes
            for (unsigned int i = 0; i < (*cur)->mNumMeshes;++i)    {
                aiMesh* mesh = (*cur)->mMeshes[i];

                // rename all bones
                for (unsigned int a = 0; a < mesh->mNumBones;++a)   {
                    if (flags & AI_INT_MERGE_SCENE_GEN_UNIQUE_NAMES_IF_NECESSARY) {
                        if (!FindNameMatch(mesh->mBones[a]->mName,src,n))
                            continue;
                    }
                    PrefixString(mesh->mBones[a]->mName,(*cur).id,(*cur).idlen);
                }
            }
        }

        // --------------------------------------------------------------------
        // Copy light sources
        for (unsigned int i = 0; i < (*cur)->mNumLights;++i,++ppLights)
        {
            if (n != (int)duplicates[n]) // duplicate scene?
            {
                Copy(ppLights, (*cur)->mLights[i]);
            }
            else *ppLights = (*cur)->mLights[i];


            // Add name prefixes?
            if (flags & AI_INT_MERGE_SCENE_GEN_UNIQUE_NAMES) {
                if (flags & AI_INT_MERGE_SCENE_GEN_UNIQUE_NAMES_IF_NECESSARY) {
                    if (!FindNameMatch((*ppLights)->mName,src,n))
                        continue;
                }

                PrefixString((*ppLights)->mName,(*cur).id,(*cur).idlen);
            }
        }

        // --------------------------------------------------------------------
        // Copy cameras
        for (unsigned int i = 0; i < (*cur)->mNumCameras;++i,++ppCameras)   {
            if (n != (int)duplicates[n]) // duplicate scene?
            {
                Copy(ppCameras, (*cur)->mCameras[i]);
            }
            else *ppCameras = (*cur)->mCameras[i];

            // Add name prefixes?
            if (flags & AI_INT_MERGE_SCENE_GEN_UNIQUE_NAMES) {
                if (flags & AI_INT_MERGE_SCENE_GEN_UNIQUE_NAMES_IF_NECESSARY) {
                    if (!FindNameMatch((*ppCameras)->mName,src,n))
                        continue;
                }

                PrefixString((*ppCameras)->mName,(*cur).id,(*cur).idlen);
            }
        }

        // --------------------------------------------------------------------
        // Copy animations
        for (unsigned int i = 0; i < (*cur)->mNumAnimations;++i,++ppAnims)  {
            if (n != (int)duplicates[n]) // duplicate scene?
            {
                Copy(ppAnims, (*cur)->mAnimations[i]);
            }
            else *ppAnims = (*cur)->mAnimations[i];

            // Add name prefixes?
            if (flags & AI_INT_MERGE_SCENE_GEN_UNIQUE_NAMES) {
                if (flags & AI_INT_MERGE_SCENE_GEN_UNIQUE_NAMES_IF_NECESSARY) {
                    if (!FindNameMatch((*ppAnims)->mName,src,n))
                        continue;
                }

                PrefixString((*ppAnims)->mName,(*cur).id,(*cur).idlen);

                // don't forget to update all node animation channels
                for (unsigned int a = 0; a < (*ppAnims)->mNumChannels;++a) {
                    if (flags & AI_INT_MERGE_SCENE_GEN_UNIQUE_NAMES_IF_NECESSARY) {
                        if (!FindNameMatch((*ppAnims)->mChannels[a]->mNodeName,src,n))
                            continue;
                    }

                    PrefixString((*ppAnims)->mChannels[a]->mNodeName,(*cur).id,(*cur).idlen);
                }
            }
        }
    }

    // Now build the output graph
    AttachToGraph ( master, nodes);
    dest->mRootNode = master->mRootNode;

    // Check whether we succeeded at building the output graph
    for (std::vector <NodeAttachmentInfo> ::iterator it = nodes.begin();
        it != nodes.end(); ++it)
    {
        if (!(*it).resolved) {
            if (flags & AI_INT_MERGE_SCENE_RESOLVE_CROSS_ATTACHMENTS) {
                // search for this attachment point in all other imported scenes, too.
                for ( unsigned int n = 0; n < src.size();++n ) {
                    if (n != (*it).src_idx) {
                        AttachToGraph(src[n].scene,nodes);
                        if ((*it).resolved)
                            break;
                    }
                }
            }
            if (!(*it).resolved) {
                ASSIMP_LOG_ERROR_F( "SceneCombiner: Failed to resolve attachment ", (*it).node->mName.data,
                    " ", (*it).attachToNode->mName.data );
            }
        }
    }

    // now delete all input scenes. Make sure duplicate scenes aren't
    // deleted more than one time
    for ( unsigned int n = 0; n < src.size();++n )  {
        if (n != duplicates[n]) // duplicate scene?
            continue;

        aiScene* deleteMe = src[n].scene;

        // We need to delete the arrays before the destructor is called -
        // we are reusing the array members
        delete[] deleteMe->mMeshes;     deleteMe->mMeshes     = NULL;
        delete[] deleteMe->mCameras;    deleteMe->mCameras    = NULL;
        delete[] deleteMe->mLights;     deleteMe->mLights     = NULL;
        delete[] deleteMe->mMaterials;  deleteMe->mMaterials  = NULL;
        delete[] deleteMe->mAnimations; deleteMe->mAnimations = NULL;

        deleteMe->mRootNode = NULL;

        // Now we can safely delete the scene
        delete deleteMe;
    }

    // Check flags
    if (!dest->mNumMeshes || !dest->mNumMaterials) {
        dest->mFlags |= AI_SCENE_FLAGS_INCOMPLETE;
    }

    // We're finished
}